

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h2(disp *this,string *s1,string *s2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char in_stack_ffffffffffffff9f;
  string local_58 [32];
  string local_38 [56];
  
  std::operator+(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90);
  std::operator+(in_RDI,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RDI,in_RDX);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void h2(std::string s1,std::string s2)
	{ v_ = ':'+s1+':'+s2; }